

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> * __thiscall
kratos::PackedStructGraph::get_structs
          (vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
           *__return_storage_ptr__,PackedStructGraph *this)

{
  PackedStructNode *node;
  long *plVar1;
  pointer ppPVar2;
  PackedStruct *pPVar3;
  long *plVar4;
  pointer ppPVar5;
  pointer ppPVar6;
  long *plVar7;
  _Hash_node_base *p_Var8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
  *__range1;
  undefined1 local_c0 [8];
  unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  visited;
  queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
  queue;
  
  local_c0 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  queue.c.super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  queue.c.super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::_Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>::
  _M_initialize_map((_Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                     *)&visited._M_h._M_single_bucket,0);
  p_Var8 = (this->nodes_)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      node = (PackedStructNode *)(p_Var8 + 5);
      plVar1 = *(long **)((long)local_c0 + ((ulong)node % (ulong)visited._M_h._M_buckets) * 8);
      plVar4 = (long *)0x0;
      if ((plVar1 != (long *)0x0) &&
         (plVar4 = plVar1, plVar7 = (long *)*plVar1,
         node != (PackedStructNode *)((long *)*plVar1)[1])) {
        while (plVar1 = (long *)*plVar7, plVar1 != (long *)0x0) {
          plVar4 = (long *)0x0;
          if (((ulong)plVar1[1] % (ulong)visited._M_h._M_buckets !=
               (ulong)node % (ulong)visited._M_h._M_buckets) ||
             (plVar4 = plVar7, plVar7 = plVar1, node == (PackedStructNode *)plVar1[1]))
          goto LAB_001939a9;
        }
        plVar4 = (long *)0x0;
      }
LAB_001939a9:
      if ((plVar4 == (long *)0x0) || (*plVar4 == 0)) {
        topological_sort_helper
                  (this,node,
                   (unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                    *)local_c0,
                   (queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                    *)&visited._M_h._M_single_bucket);
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  (__return_storage_ptr__->
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::reserve
            (__return_storage_ptr__,0);
  while (queue.c.
         super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
         _M_impl.super__Deque_impl_data._M_map_size != 0) {
    std::vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>>::
    emplace_back<kratos::PackedStruct_const*&>
              ((vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>> *)
               __return_storage_ptr__,
               (PackedStruct **)
               (*(long *)queue.c.
                         super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                         ._M_impl.super__Deque_impl_data._M_map_size + 8));
    if ((_Elt_pointer)
        queue.c.
        super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
        _M_impl.super__Deque_impl_data._M_map_size ==
        queue.c.
        super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_first + -1) {
      operator_delete(queue.c.
                      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,0x200);
      queue.c.
      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
      _M_impl.super__Deque_impl_data._M_map_size =
           (size_t)queue.c.
                   super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last[1];
      queue.c.
      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first =
           (_Elt_pointer)
           (queue.c.
            super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
            ._M_impl.super__Deque_impl_data._M_map_size + 0x200);
      queue.c.
      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)
           queue.c.
           super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
           ._M_impl.super__Deque_impl_data._M_map_size;
      queue.c.
      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_last =
           queue.c.
           super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last + 1;
    }
    else {
      queue.c.
      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
      _M_impl.super__Deque_impl_data._M_map_size =
           queue.c.
           super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
           ._M_impl.super__Deque_impl_data._M_map_size + 8;
    }
  }
  ppPVar2 = (__return_storage_ptr__->
            super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppPVar5 = (__return_storage_ptr__->
            super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppPVar6 = ppPVar5 + -1;
  if (ppPVar2 < ppPVar6 && ppPVar2 != ppPVar5) {
    do {
      ppPVar5 = ppPVar2 + 1;
      pPVar3 = *ppPVar2;
      *ppPVar2 = *ppPVar6;
      *ppPVar6 = pPVar3;
      ppPVar6 = ppPVar6 + -1;
      ppPVar2 = ppPVar5;
    } while (ppPVar5 < ppPVar6);
  }
  std::_Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>::
  ~_Deque_base((_Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                *)&visited._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const PackedStruct *> PackedStructGraph::get_structs() {
    // leaf nodes need to be returned first
    std::unordered_set<PackedStructNode *> visited;
    std::queue<PackedStructNode *> queue;
    for (auto &iter : nodes_) {
        auto *node = &iter.second;
        if (visited.find(node) == visited.end()) {
            // visit it
            topological_sort_helper(this, node, visited, queue);
        }
    }
    std::vector<const PackedStruct *> result;
    result.reserve(queue.size());
    while (!queue.empty()) {
        result.emplace_back(queue.front()->struct_);
        queue.pop();
    }
    std::reverse(result.begin(), result.end());
    return result;
}